

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O0

void __thiscall Object_Empty_Test<char>::TestBody(Object_Empty_Test<char> *this)

{
  bool bVar1;
  char *message;
  size_t in_RCX;
  void *__buf;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  __string_type *actual;
  undefined1 local_38 [8];
  object v;
  Object_Empty_Test<char> *this_local;
  
  v._32_8_ = this;
  pstore::dump::object::object((object *)local_38);
  pstore::dump::value::write((value *)local_38,(int)this + 0x10,__buf,in_RCX);
  std::__cxx11::ostringstream::str();
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expected;
  convert<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &gtest_ar.message_,"{ }");
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_a8,"expected","actual",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0x37,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&expected);
  pstore::dump::object::~object((object *)local_38);
  return;
}

Assistant:

TYPED_TEST (Object, Empty) {
    pstore::dump::object v;
    v.write (this->out);
    auto const & actual = this->out.str ();
    auto const & expected = convert<TypeParam> ("{ }");
    EXPECT_EQ (expected, actual);
}